

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

void __thiscall Vault::HttpClient::HttpClient(HttpClient *this,Config *config)

{
  anon_class_1_0_00000001 local_1a;
  anon_class_1_0_00000001 local_19;
  Config *local_18;
  Config *config_local;
  HttpClient *this_local;
  
  this->_vptr_HttpClient = (_func_int **)&PTR__HttpClient_0026da88;
  local_18 = config;
  config_local = (Config *)this;
  Config::Config(&this->config_,config);
  std::function<void(std::__cxx11::string)>::
  function<Vault::HttpClient::HttpClient(Vault::Config)::__0,void>
            ((function<void(std::__cxx11::string)> *)&this->errorCallback_,&local_19);
  std::function<void(Vault::HttpResponse_const&)>::
  function<Vault::HttpClient::HttpClient(Vault::Config)::__1,void>
            ((function<void(Vault::HttpResponse_const&)> *)&this->responseErrorCallback_,&local_1a);
  return;
}

Assistant:

Vault::HttpClient::HttpClient(Vault::Config config)
    : config_(std::move(config)),
      errorCallback_([&]([[maybe_unused]] const std::string &err) {}),
      responseErrorCallback_([&]([[maybe_unused]] const HttpResponse &err) {}) {
}